

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O2

uint8_t * openMerkleTree(tree_t *tree,uint16_t *missingLeaves,size_t missingLeavesSize,
                        size_t *outputSizeBytes)

{
  uint uVar1;
  size_t sVar2;
  uint *__ptr;
  uint8_t *puVar3;
  ulong __n;
  uint8_t *__dest;
  size_t i;
  size_t sVar4;
  size_t revealedSize;
  size_t local_38;
  
  local_38 = 0;
  __ptr = getRevealedMerkleNodes(tree,missingLeaves,missingLeavesSize,&local_38);
  sVar2 = local_38;
  if (__ptr == (uint *)0x0) {
    puVar3 = (uint8_t *)0x0;
  }
  else {
    uVar1 = tree->dataSize;
    __n = (ulong)uVar1;
    *outputSizeBytes = local_38 * __n;
    puVar3 = (uint8_t *)malloc(local_38 * __n);
    if (puVar3 == (uint8_t *)0x0) {
      puVar3 = (uint8_t *)0x0;
    }
    else {
      __dest = puVar3;
      for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
        memcpy(__dest,tree->nodes + __ptr[sVar4] * uVar1,__n);
        __dest = __dest + __n;
      }
    }
    free(__ptr);
  }
  return puVar3;
}

Assistant:

uint8_t* openMerkleTree(tree_t* tree, uint16_t* missingLeaves, size_t missingLeavesSize,
                        size_t* outputSizeBytes) {
  size_t revealedSize = 0;
  unsigned int* revealed =
      getRevealedMerkleNodes(tree, missingLeaves, missingLeavesSize, &revealedSize);
  if (!revealed) {
    return NULL;
  }

  /* Serialize output */
  *outputSizeBytes = revealedSize * tree->dataSize;
  uint8_t* output  = malloc(*outputSizeBytes);
  if (!output) {
    free(revealed);
    return NULL;
  }

  uint8_t* outputBase = output;
  for (size_t i = 0; i < revealedSize; i++) {
    memcpy(output, &tree->nodes[revealed[i] * tree->dataSize], tree->dataSize);
    output += tree->dataSize;
  }

  free(revealed);
  return outputBase;
}